

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger string_split(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  bool bVar2;
  SQChar *pSVar3;
  int iVar4;
  SQObjectValue this;
  SQInteger SVar5;
  undefined4 extraout_var;
  size_t extraout_RAX;
  size_t sVar6;
  size_t extraout_RAX_00;
  long lVar7;
  long lVar8;
  SQInteger len;
  SQChar *str;
  SQInteger sep_len;
  SQChar *sep;
  SQObject local_68;
  long local_58;
  SQChar *local_50;
  size_t local_48;
  size_t local_40;
  char *local_38;
  
  sq_getstringandsize(v,1,&local_50,&local_58);
  ss = v->_sharedstate;
  this.pUserPointer = sq_vm_malloc(ss->_alloc_ctx,0x48);
  SQArray::SQArray(this.pArray,ss,0);
  SVar5 = sq_gettop(v);
  if (SVar5 == 1) {
    if (-1 < local_58) {
      lVar7 = 0;
      lVar8 = 0;
      do {
        if ((lVar8 == local_58) || (iVar4 = isspace((int)local_50[lVar8]), iVar4 != 0)) {
          if (lVar8 - lVar7 != 0 && lVar7 <= lVar8) {
            local_68._unVal.pString =
                 SQString::Create(v->_sharedstate,local_50 + lVar7,lVar8 - lVar7);
            local_68._type = OT_STRING;
            local_68._flags = '\0';
            pSVar1 = &((local_68._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                      super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
            SQArray::Append(this.pArray,&local_68);
            SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
          }
          lVar7 = lVar8 + 1;
        }
        bVar2 = lVar8 < local_58;
        lVar8 = lVar8 + 1;
      } while (bVar2);
    }
  }
  else {
    sq_getstringandsize(v,2,&local_38,(SQInteger *)&local_48);
    local_40 = local_48;
    if ((long)local_48 < 1) {
      sVar6 = sq_throwerror(v,"empty separator");
    }
    else {
      sVar6 = local_48;
      if (-1 < local_58) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          pSVar3 = local_50;
          if ((long)(local_58 - local_48) < lVar7) {
            local_68._unVal.pString =
                 SQString::Create(v->_sharedstate,local_50 + lVar8,local_58 - lVar8);
            local_68._type = OT_STRING;
            local_68._flags = '\0';
            pSVar1 = &((local_68._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                      super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
            SQArray::Append(this.pArray,&local_68);
            SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
            sVar6 = extraout_RAX_00;
            break;
          }
          iVar4 = strncmp(local_50 + lVar7,local_38,local_48);
          sVar6 = CONCAT44(extraout_var,iVar4);
          if (iVar4 == 0) {
            local_68._unVal.pString = SQString::Create(v->_sharedstate,pSVar3 + lVar8,lVar7 - lVar8)
            ;
            local_68._type = OT_STRING;
            local_68._flags = '\0';
            pSVar1 = &((local_68._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                      super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
            SQArray::Append(this.pArray,&local_68);
            SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
            lVar8 = lVar7 + local_48;
            sVar6 = extraout_RAX;
            lVar7 = lVar8;
          }
          else {
            lVar7 = lVar7 + 1;
          }
        } while (lVar7 <= local_58);
      }
    }
    if ((long)local_40 < 1) {
      return sVar6;
    }
  }
  local_68._type = OT_ARRAY;
  local_68._flags = '\0';
  pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_68._unVal.pUserPointer = this.pUserPointer;
  SQVM::Push(v,(SQObjectPtr *)&local_68);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_68);
  return 1;
}

Assistant:

static SQInteger string_split(HSQUIRRELVM v)
{
    const SQChar *str;
    SQInteger len;
    sq_getstringandsize(v, 1, &str, &len);

    SQArray *res = SQArray::Create(_ss(v),0);

    if (sq_gettop(v) == 1) {
        SQInteger start = 0;
        for (SQInteger pos=0; pos<=len; ++pos) {
            if (pos==len || isspace(str[pos])) {
                if (pos > start)
                    res->Append(SQObjectPtr(SQString::Create(_ss(v), str+start, pos-start)));
                start = pos+1;
            }
        }
    } else {
        const SQChar *sep;
        SQInteger sep_len;
        sq_getstringandsize(v, 2, &sep, &sep_len);
        if (sep_len < 1)
            return sq_throwerror(v, _SC("empty separator"));
        SQInteger start = 0;
        for (SQInteger pos=0; pos<=len;) {
            if (pos>len-sep_len) {
                res->Append(SQObjectPtr(SQString::Create(_ss(v), str+start, len-start)));
                break;
            }
            else if (strncmp(str+pos, sep, sep_len)==0) {
                res->Append(SQObjectPtr(SQString::Create(_ss(v), str+start, pos-start)));
                pos += sep_len;
                start = pos;
            }
            else
                ++pos;
        }
    }
    v->Push(res);
    return 1;
}